

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O0

int __thiscall pbrt::InfiniteLightSource::writeTo(InfiniteLightSource *this,BinaryWriter *binary)

{
  size_t in_RCX;
  void *in_RDX;
  BinaryWriter *in_RSI;
  affine3f *in_RDI;
  
  BinaryWriter::write(in_RSI,(int)in_RDI + 0x18,in_RDX,in_RCX);
  BinaryWriter::write<pbrt::math::affine3f>(in_RSI,in_RDI);
  BinaryWriter::write<pbrt::math::vec3f>(in_RSI,(vec3f *)in_RDI);
  BinaryWriter::write<pbrt::math::vec3f>(in_RSI,(vec3f *)in_RDI);
  BinaryWriter::write<int>(in_RSI,(int *)in_RDI);
  return 0x46;
}

Assistant:

int InfiniteLightSource::writeTo(BinaryWriter &binary) 
  {
    binary.write(mapName);
    binary.write(transform);
    binary.write(L);
    binary.write(scale);
    binary.write(nSamples);
    return TYPE_INFINITE_LIGHT_SOURCE;
  }